

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderMatrixTests.cpp
# Opt level: O0

void deqp::gles2::Functional::MatrixCaseUtils::Evaluator<3,_2,_9,_2,_1>::evaluate
               (ShaderEvalContext *evalCtx)

{
  int in_ECX;
  float scalar;
  VecAccess<float,_4,_3> local_90;
  Mat3 local_64;
  Matrix<float,_3,_3> local_40;
  Vector<float,_3> local_1c;
  ShaderEvalContext *local_10;
  ShaderEvalContext *evalCtx_local;
  
  local_10 = evalCtx;
  getInputValue<2,9>(&local_64,(MatrixCaseUtils *)evalCtx,(ShaderEvalContext *)0x0,in_ECX);
  scalar = getInputValue<2,1>(local_10,1);
  tcu::operator/(&local_40,&local_64,scalar);
  MatrixCaseUtils::reduceToVec3((MatrixCaseUtils *)&local_1c,&local_40);
  tcu::Vector<float,_4>::xyz(&local_90,&local_10->color);
  tcu::VecAccess<float,_4,_3>::operator=(&local_90,&local_1c);
  tcu::Matrix<float,_3,_3>::~Matrix(&local_40);
  tcu::Matrix<float,_3,_3>::~Matrix(&local_64);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx)
	{
		evalCtx.color.xyz() = reduceToVec3(getInputValue<In0Type, In0DataType>(evalCtx, 0) / getInputValue<In1Type, In1DataType>(evalCtx, 1));
	}